

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O2

Stats * __thiscall
Enhedron::Test::Impl::Impl_Suite::
Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp:35:38)>_>
::run(Stats *__return_storage_ptr__,
     Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:35:38)>_>
     *this,PathList *pathList,Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> results,
     size_t depth)

{
  string *psVar1;
  uint64_t uVar2;
  Results *pRVar3;
  pointer pSVar4;
  bool bVar5;
  pointer pSVar6;
  pointer pSVar7;
  size_t sVar8;
  uint64_t uVar9;
  WhenRunner whenRunner;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  string local_e8;
  WhenRunner local_c8;
  
  psVar1 = &this->name;
  pRVar3 = ((results.value)->results_).value;
  (*pRVar3->_vptr_Results[5])(pRVar3,&(results.value)->contextStack_,psVar1);
  __return_storage_ptr__->checks_ = 0;
  __return_storage_ptr__->failedTests_ = 0;
  __return_storage_ptr__->fixtures_ = 0;
  __return_storage_ptr__->tests_ = 0;
  __return_storage_ptr__->failedChecks_ = 0;
  bVar5 = included(this,pathList,depth);
  if (!bVar5) {
LAB_0014376e:
    pRVar3 = ((results.value)->results_).value;
    (*pRVar3->_vptr_Results[6])
              (pRVar3,__return_storage_ptr__,&(results.value)->contextStack_,psVar1);
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)&local_e8,(string *)psVar1);
  WhenRunner::WhenRunner(&local_c8,results,&local_e8);
  ::std::__cxx11::string::~string((string *)&local_e8);
  if (local_c8.whenStack.
      super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_c8.whenStack.
      super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_c8.whenStack.
    super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_c8.whenStack.
         super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_c8.whenDepth_ = 0;
  uVar2 = local_c8.stats_.fixtures_ + 1;
  pSVar7 = local_c8.whenStack.
           super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar6 = local_c8.whenStack.
           super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    for (; pSVar7 != pSVar6; pSVar7 = pSVar7 + 1) {
      pSVar7->current = 0;
    }
    local_c8.stats_.tests_ = local_c8.stats_.tests_ + 1;
    pSVar7 = pSVar6;
    pSVar4 = local_c8.whenStack.
             super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      local_c8.whenStack.
      super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar4;
      pSVar6 = pSVar7;
      pSVar7 = pSVar6 + -1;
      if (pSVar6 == local_c8.whenStack.
                    super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        uVar9 = local_c8.stats_.tests_ + (local_c8.stats_.tests_ == 0);
        local_c8.stats_.fixtures_ = uVar2;
        local_c8.stats_.tests_ = uVar9;
        WhenRunner::~WhenRunner(&local_c8);
        __return_storage_ptr__->fixtures_ = uVar2;
        __return_storage_ptr__->tests_ = uVar9;
        local_f8 = (undefined4)local_c8.stats_.checks_;
        uStack_f4 = (undefined4)(local_c8.stats_.checks_ >> 0x20);
        uStack_f0 = (undefined4)local_c8.stats_.failedTests_;
        uStack_ec = (undefined4)(local_c8.stats_.failedTests_ >> 0x20);
        *(undefined4 *)&__return_storage_ptr__->checks_ = local_f8;
        *(undefined4 *)((long)&__return_storage_ptr__->checks_ + 4) = uStack_f4;
        *(undefined4 *)&__return_storage_ptr__->failedTests_ = uStack_f0;
        *(undefined4 *)((long)&__return_storage_ptr__->failedTests_ + 4) = uStack_ec;
        __return_storage_ptr__->failedChecks_ = local_c8.stats_.failedChecks_;
        goto LAB_0014376e;
      }
      sVar8 = pSVar7->index + 1;
      pSVar4 = pSVar7;
    } while (pSVar6[-1].current == sVar8);
    pSVar7->index = sVar8;
    pSVar7 = local_c8.whenStack.
             super__Vector_base<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement,_std::allocator<Enhedron::Test::Impl::Impl_Suite::WhenRunner::StackElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
  } while( true );
}

Assistant:

virtual Stats run(const PathList& pathList, Out<ContextResultsRecorder> results, size_t depth) override {
            results->beginGiven(name);
            Stats stats;

            if (included(pathList, depth)) {
                stats += args.applyExtraBefore(runTest, name, results);
            }

            results->endGiven(stats, name);

            return stats;
        }